

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O2

FUNCTION_RETURN getDiskInfos(DiskInfo *diskInfos,size_t *disk_info_size)

{
  int iVar1;
  int iVar2;
  DiskInfo *pDVar3;
  void *__ptr;
  undefined8 *puVar4;
  DiskInfo *pDVar5;
  dirent *pdVar6;
  size_t __size;
  ulong *puVar7;
  size_t __n;
  ushort **ppuVar8;
  __ino_t _Var9;
  DIR *__dirp;
  int *piVar10;
  DiskInfo *pDVar11;
  uchar *puVar12;
  uint uVar13;
  FUNCTION_RETURN FVar14;
  DiskInfo *pDVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  char *pcVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar21;
  uchar cur_character;
  DiskInfo *local_1190;
  ulong *local_1188;
  DiskInfo *local_1180;
  DIR *local_1178;
  void *local_1170;
  __ino_t local_1168;
  DiskInfo *local_1160;
  stat sym_stat;
  stat mount_stat;
  char cur_dir [4096];
  
  local_1188 = disk_info_size;
  if (diskInfos == (DiskInfo *)0x0) {
    pDVar3 = (DiskInfo *)malloc(0x28f0);
    lVar18 = 0x14;
  }
  else {
    lVar18 = (long)(int)*disk_info_size;
    pDVar3 = diskInfos;
  }
  pDVar15 = (DiskInfo *)0x0;
  memset(pDVar3,0,lVar18 * 0x20c);
  __ptr = calloc(1,lVar18 << 3);
  lVar18 = setmntent("/proc/mounts","r");
  pDVar5 = diskInfos;
  if (lVar18 == 0) {
    free(pDVar3);
LAB_0025bc4e:
    free(__ptr);
    return FUNC_RET_ERROR;
  }
  while( true ) {
    local_1180 = pDVar5;
    local_1190 = pDVar3;
    puVar4 = (undefined8 *)getmntent(lVar18);
    iVar2 = (int)pDVar15;
    uVar16 = (ulong)iVar2;
    if (puVar4 == (undefined8 *)0x0) break;
    pcVar19 = (char *)puVar4[2];
    if (*pcVar19 == 'x') {
      if ((pcVar19[1] != 'f') || (pcVar19[2] != 's')) goto LAB_0025bb0c;
      goto LAB_0025bb38;
    }
    if ((*pcVar19 == 'e') && ((pcVar19[1] == 'x' && (pcVar19[2] == 't')))) goto LAB_0025bb38;
LAB_0025bb0c:
    iVar1 = strncmp(pcVar19,"vfat",4);
    if ((iVar1 == 0) ||
       (iVar1 = strncmp(pcVar19,"ntfs",4), pDVar3 = local_1190, pDVar5 = local_1180, iVar1 == 0)) {
LAB_0025bb38:
      pcVar19 = (char *)*puVar4;
      pDVar3 = local_1190;
      pDVar5 = local_1180;
      if (((pcVar19 != (char *)0x0) &&
          (iVar1 = strncmp(pcVar19,"/dev/",5), pDVar3 = local_1190, pDVar5 = local_1180, iVar1 == 0)
          ) && (iVar1 = stat(pcVar19,(stat *)&mount_stat), _Var9 = mount_stat.st_ino,
               pDVar3 = local_1190, pDVar5 = local_1180, iVar1 == 0)) {
        pDVar3 = (DiskInfo *)0x0;
        if (0 < iVar2) {
          pDVar3 = pDVar15;
        }
        pDVar5 = (DiskInfo *)0xffffffffffffffff;
        for (pDVar11 = (DiskInfo *)0x0; iVar1 = (int)pDVar5, pDVar3 != pDVar11;
            pDVar11 = (DiskInfo *)((long)&pDVar11->id + 1)) {
          if (*(__ino_t *)((long)__ptr + (long)pDVar11 * 8) == mount_stat.st_ino) {
            pDVar5 = pDVar11;
          }
          pDVar5 = (DiskInfo *)((ulong)pDVar5 & 0xffffffff);
        }
        if (iVar1 == -1) {
          strncpy(local_1190[uVar16].device,(char *)*puVar4,0xfe);
          *(__ino_t *)((long)__ptr + uVar16 * 8) = _Var9;
          pDVar15 = (DiskInfo *)(ulong)(iVar2 + 1);
          iVar1 = iVar2;
        }
        pDVar3 = local_1190;
        pDVar5 = local_1180;
        if ((*(char *)puVar4[1] == '/') && (((char *)puVar4[1])[1] == '\0')) {
          local_1190[iVar1].label[4] = '\0';
          builtin_strncpy(local_1190[iVar1].label,"root",4);
          local_1190[iVar1].preferred = true;
        }
      }
    }
  }
  endmntent(lVar18);
  puVar7 = local_1188;
  if (local_1180 == (DiskInfo *)0x0) {
    *local_1188 = uVar16;
    free(local_1190);
  }
  else {
    if (*local_1188 < uVar16) {
      FVar14 = FUNC_RET_BUFFER_TOO_SMALL;
      goto LAB_0025bf04;
    }
    local_1178 = opendir("/dev/disk/by-uuid");
    if (local_1178 == (DIR *)0x0) {
      piVar10 = __errno_location();
      uVar20 = extraout_XMM0_Da;
      uVar21 = extraout_XMM0_Db;
      if (*piVar10 != 0) {
        strerror(*piVar10);
        uVar20 = extraout_XMM0_Da_00;
        uVar21 = extraout_XMM0_Db_00;
      }
      _log((double)CONCAT44(uVar21,uVar20));
      goto LAB_0025bc4e;
    }
    *puVar7 = uVar16;
    pDVar3 = local_1190;
    local_1180 = pDVar15;
    local_1170 = __ptr;
    if (iVar2 < 1) {
      local_1180 = (DiskInfo *)0x0;
    }
    while (pdVar6 = readdir(local_1178), pdVar6 != (dirent *)0x0) {
      builtin_strncpy(cur_dir,"/dev/disk/by-uuid/",0x13);
      pcVar19 = pdVar6->d_name;
      strncat(cur_dir,pcVar19,200);
      iVar2 = stat(cur_dir,(stat *)&sym_stat);
      if (iVar2 == 0) {
        local_1168 = sym_stat.st_ino;
        _Var9 = sym_stat.st_ino;
        for (pDVar5 = (DiskInfo *)0x0; pDVar5 != local_1180;
            pDVar5 = (DiskInfo *)((long)&pDVar5->id + 1)) {
          if (_Var9 == *(__ino_t *)((long)__ptr + (long)pDVar5 * 8)) {
            puVar12 = pDVar3[(long)pDVar5].disk_sn;
            local_1160 = pDVar5;
            __size = strlen(pcVar19);
            puVar7 = (ulong *)malloc(__size);
            puVar12[0] = '\0';
            puVar12[1] = '\0';
            puVar12[2] = '\0';
            puVar12[3] = '\0';
            puVar12[4] = '\0';
            puVar12[5] = '\0';
            puVar12[6] = '\0';
            puVar12[7] = '\0';
            __n = strlen(pcVar19);
            uVar13 = 0;
            local_1188 = puVar7;
            memset(puVar7,0,__n);
            uVar17 = 0;
            while( true ) {
              pDVar3 = local_1190;
              uVar16 = (ulong)uVar13;
              if (__size <= uVar17) break;
              ppuVar8 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar8 + (long)pcVar19[uVar17] * 2 + 1) & 0x10) != 0) {
                *(char *)((long)local_1188 + uVar16) = pcVar19[uVar17];
                uVar13 = uVar13 + 1;
              }
              uVar17 = uVar17 + 1;
            }
            if ((uVar13 & 1) != 0) {
              uVar13 = uVar13 + 1;
              *(undefined1 *)((long)local_1188 + uVar16) = 0x30;
            }
            *(undefined1 *)((long)local_1188 + (ulong)uVar13) = 0;
            puVar7 = local_1188;
            for (uVar16 = 0; uVar13 >> 1 != uVar16; uVar16 = uVar16 + 1) {
              __isoc99_sscanf(puVar7,"%2hhx",&cur_character);
              puVar12[(uint)uVar16 & 7] = puVar12[(uint)uVar16 & 7] ^ cur_character;
              puVar7 = (ulong *)((long)puVar7 + 2);
            }
            free(local_1188);
            _Var9 = local_1168;
            pDVar5 = local_1160;
            __ptr = local_1170;
          }
        }
      }
    }
    closedir(local_1178);
    __dirp = opendir("/dev/disk/by-label");
    if (__dirp != (DIR *)0x0) {
      local_1190 = (DiskInfo *)pDVar3->label;
      while (pdVar6 = readdir(__dirp), pdVar6 != (dirent *)0x0) {
        builtin_strncpy(cur_dir,"/dev/disk/by-label/",0x14);
        strcat(cur_dir,pdVar6->d_name);
        iVar2 = stat(cur_dir,(stat *)&sym_stat);
        if (iVar2 == 0) {
          pDVar3 = local_1190;
          for (pDVar5 = (DiskInfo *)0x0; local_1180 != pDVar5;
              pDVar5 = (DiskInfo *)((long)&pDVar5->id + 1)) {
            if (sym_stat.st_ino == *(__ino_t *)((long)__ptr + (long)pDVar5 * 8)) {
              strncpy((char *)pDVar3,pdVar6->d_name,0xfe);
              printf("label %d %s %s\n",(ulong)pDVar5 & 0xffffffff,pDVar3,pDVar3[-1].disk_sn + 2);
            }
            pDVar3 = pDVar3 + 1;
          }
        }
      }
      closedir(__dirp);
    }
  }
  FVar14 = FUNC_RET_OK;
LAB_0025bf04:
  free(__ptr);
  return FVar14;
}

Assistant:

FUNCTION_RETURN getDiskInfos(DiskInfo * diskInfos, size_t * disk_info_size) {
	struct stat mount_stat, sym_stat;
	/*static char discard[1024];
	 char device[64], name[64], type[64];
	 */
	char cur_dir[MAX_PATH];
	struct mntent *ent;

	int maxDrives, currentDrive, i, drive_found;
	__ino64_t *statDrives = NULL;
	DiskInfo *tmpDrives = NULL;
	FILE *aFile = NULL;
	DIR *disk_by_uuid_dir = NULL, *disk_by_label = NULL;
	struct dirent *dir = NULL;
	FUNCTION_RETURN result;

	if (diskInfos != NULL) {
		maxDrives = *disk_info_size;
		tmpDrives = diskInfos;
	} else {
		maxDrives = MAX_UNITS;
		tmpDrives = (DiskInfo *) malloc(sizeof(DiskInfo) * maxDrives);
	}
	memset(tmpDrives, 0, sizeof(DiskInfo) * maxDrives);
	statDrives = (__ino64_t *) malloc(maxDrives * sizeof(__ino64_t ));
	memset(statDrives, 0, sizeof(__ino64_t ) * maxDrives);
	;

	aFile = setmntent("/proc/mounts", "r");
	if (aFile == NULL) {
		/*proc not mounted*/
		free(tmpDrives);
		free(statDrives);
		return FUNC_RET_ERROR;
	}

	currentDrive = 0;
	while (NULL != (ent = getmntent(aFile))) {
		if ((strncmp(ent->mnt_type, "ext", 3) == 0
				|| strncmp(ent->mnt_type, "xfs", 3) == 0
				|| strncmp(ent->mnt_type, "vfat", 4) == 0
				|| strncmp(ent->mnt_type, "ntfs", 4) == 0)
				&& ent->mnt_fsname != NULL
				&& strncmp(ent->mnt_fsname, "/dev/", 5) == 0) {
			if (stat(ent->mnt_fsname, &mount_stat) == 0) {
				drive_found = -1;
				for (i = 0; i < currentDrive; i++) {
					if (statDrives[i] == mount_stat.st_ino) {
						drive_found = i;
					}
				}
				if (drive_found == -1) {
					LOG_DEBUG("mntent: %s %s %d\n", ent->mnt_fsname, ent->mnt_dir,
							(unsigned long int)mount_stat.st_ino);
					strncpy(tmpDrives[currentDrive].device, ent->mnt_fsname, 255-1);
					statDrives[currentDrive] = mount_stat.st_ino;
					drive_found = currentDrive;
					currentDrive++;
				}
				if (strcmp(ent->mnt_dir, "/") == 0) {
					strcpy(tmpDrives[drive_found].label, "root");
					LOG_DEBUG("drive %s set to preferred\n", ent->mnt_fsname);
					tmpDrives[drive_found].preferred = true;
				}
			}
		}
	}
	endmntent(aFile);

	if (diskInfos == NULL) {
		*disk_info_size = currentDrive;
		free(tmpDrives);
		result = FUNC_RET_OK;
	} else if (*disk_info_size >= currentDrive) {
		disk_by_uuid_dir = opendir("/dev/disk/by-uuid");
		if (disk_by_uuid_dir == NULL) {
			LOG_WARN("Open /dev/disk/by-uuid fail");
			free(statDrives);
			return FUNC_RET_ERROR;
		}
		result = FUNC_RET_OK;
		*disk_info_size = currentDrive;
		while ((dir = readdir(disk_by_uuid_dir)) != NULL) {
			strcpy(cur_dir, "/dev/disk/by-uuid/");
			strncat(cur_dir, dir->d_name, 200);
			if (stat(cur_dir, &sym_stat) == 0) {
				for (i = 0; i < currentDrive; i++) {
					if (sym_stat.st_ino == statDrives[i]) {
						parseUUID(dir->d_name, tmpDrives[i].disk_sn,
								sizeof(tmpDrives[i].disk_sn));
#ifdef _DEBUG
						VALGRIND_CHECK_VALUE_IS_DEFINED(tmpDrives[i].device);

						LOG_DEBUG("uuid %d %s %02x%02x%02x%02x\n", i,
								tmpDrives[i].device,
								tmpDrives[i].disk_sn[0],
								tmpDrives[i].disk_sn[1],
								tmpDrives[i].disk_sn[2],
								tmpDrives[i].disk_sn[3]);
#endif
					}
				}
			}
		}
		closedir(disk_by_uuid_dir);

		disk_by_label = opendir("/dev/disk/by-label");
		if (disk_by_label != NULL) {
			while ((dir = readdir(disk_by_label)) != NULL) {
				strcpy(cur_dir, "/dev/disk/by-label/");
				strcat(cur_dir, dir->d_name);
				if (stat(cur_dir, &sym_stat) == 0) {
					for (i = 0; i < currentDrive; i++) {
						if (sym_stat.st_ino == statDrives[i]) {
							strncpy(tmpDrives[i].label, dir->d_name, 255-1);
							printf("label %d %s %s\n", i, tmpDrives[i].label,
									tmpDrives[i].device);
						}
					}
				}
			}
			closedir(disk_by_label);
		}
	} else {
		result = FUNC_RET_BUFFER_TOO_SMALL;
	}
	/*
	 FILE *mounts = fopen(_PATH_MOUNTED, "r");
	 if (mounts == NULL) {
	 return ERROR;
	 }

	 while (fscanf(mounts, "%64s %64s %64s %1024[^\n]", device, name, type,
	 discard) != EOF) {
	 if (stat(device, &mount_stat) != 0)
	 continue;
	 if (filename_stat.st_dev == mount_stat.st_rdev) {
	 fprintf(stderr, "device: %s; name: %s; type: %s\n", device, name,
	 type);
	 }
	 }
	 */
	free(statDrives);
	return result;
}